

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

int __thiscall
gl4cts::SparseTexture2CommitmentTestCase::init
          (SparseTexture2CommitmentTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *extraout_RAX;
  int *piVar1;
  iterator iVar2;
  int local_18 [2];
  
  SparseTextureCommitmentTestCase::init(&this->super_SparseTextureCommitmentTestCase,ctx);
  piVar1 = (this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       (this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current != piVar1) {
    (this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar1
    ;
    iVar2._M_current = piVar1;
  }
  this_00 = &(this->super_SparseTextureCommitmentTestCase).mSupportedTargets;
  local_18[1] = 0x9100;
  piVar1 = (this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar2._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar2,local_18 + 1);
    iVar2._M_current =
         (this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    piVar1 = (this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    *iVar2._M_current = 0x9100;
    iVar2._M_current = iVar2._M_current + 1;
    (this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar2._M_current;
  }
  local_18[0] = 0x9102;
  if (iVar2._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar2,local_18);
    piVar1 = extraout_RAX;
  }
  else {
    *iVar2._M_current = 0x9102;
    (this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar2._M_current + 1;
  }
  return (int)piVar1;
}

Assistant:

void SparseTexture2CommitmentTestCase::init()
{
	SparseTextureCommitmentTestCase::init();

	//Verify all targets once again and multisample targets as it was added in ARB_sparse_texture2 extension
	mSupportedTargets.clear();
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
}